

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O2

u8string *
jessilib::io::process_message<jessilib::io::ansi::text_wrapper>
          (u8string *__return_storage_ptr__,formatted_message *msg)

{
  pointer ptVar1;
  basic_string_view<char8_t> format_str;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
  aVar2;
  type tVar3;
  text *text;
  pointer ptVar4;
  basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  args_00;
  vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
  args;
  basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  arg;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
  local_78;
  long lStack_70;
  undefined8 local_68;
  undefined1 local_58 [16];
  type local_48;
  
  local_78.values_ =
       (value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
        *)0x0;
  lStack_70 = 0;
  local_68 = 0;
  ptVar1 = (msg->m_message).
           super__Vector_base<jessilib::io::text,_std::allocator<jessilib::io::text>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar4 = (msg->m_message).
                super__Vector_base<jessilib::io::text,_std::allocator<jessilib::io::text>_>._M_impl.
                super__Vector_impl_data._M_start; aVar2 = local_78, ptVar4 != ptVar1;
      ptVar4 = ptVar4 + 1) {
    local_48 = custom_type;
    local_58._8_8_ =
         fmt::v8::detail::
         value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>
         ::
         format_custom_arg<jessilib::io::ansi::text_wrapper,fmt::v8::formatter<jessilib::io::ansi::text_wrapper,char8_t,void>>
    ;
    local_58._0_8_ = ptVar4;
    std::
    vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>,std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>>>
    ::
    emplace_back<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>>
              ((vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>,std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>>>
                *)&local_78,
               (basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
                *)local_58);
  }
  tVar3 = fmt::v8::detail::to_unsigned<int>((int)((ulong)(lStack_70 - (long)local_78) >> 5));
  args_00.desc_ = (ulong)tVar3 | 0x8000000000000000;
  format_str.data_ = (msg->m_format)._M_dataplus._M_p;
  format_str.size_ = (msg->m_format)._M_string_length;
  args_00.field_1.values_ = aVar2.values_;
  fmt::v8::vformat<char8_t,_0>(__return_storage_ptr__,format_str,args_00);
  std::
  _Vector_base<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
  ::~_Vector_base((_Vector_base<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
                   *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::u8string process_message(const jessilib::io::formatted_message& msg) {
	using FormatCharT = char8_t;
	using format_args_type = fmt::basic_format_args<fmt::buffer_context<FormatCharT>>;
	using format_arg_type = format_args_type::format_arg;
	using format_context_type = fmt::buffer_context<FormatCharT>;
	using string_view_type = fmt::v8::basic_string_view<FormatCharT>;

	// Populate args
	std::vector<format_arg_type> args;
	for (auto& text : msg.get_message()) {
		args.emplace_back(fmt::detail::make_arg<format_context_type>(wrap_text<WrapperT>(text)));
	}

	// Pass args into vformat
	format_args_type text_args{ args.data(), static_cast<int>(args.size()) };
	string_view_type fmt_view{ msg.format().data(), msg.format().size() };
	return fmt::vformat(fmt_view, text_args);
}